

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O2

bool operator<(IndexCrossing *x,IndexCrossing *y)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  iVar1 = (x->a).shape_id;
  iVar2 = (y->a).shape_id;
  bVar3 = true;
  if (iVar2 <= iVar1) {
    if (iVar1 <= iVar2) {
      iVar1 = (x->a).edge_id;
      iVar2 = (y->a).edge_id;
      if (iVar1 < iVar2) {
        return true;
      }
      if (iVar1 <= iVar2) {
        iVar1 = (x->b).shape_id;
        iVar2 = (y->b).shape_id;
        if (iVar1 < iVar2) {
          return true;
        }
        if (iVar1 <= iVar2) {
          return (x->b).edge_id < (y->b).edge_id;
        }
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool operator<(const IndexCrossing& x, const IndexCrossing& y) {
      // The compiler (2017) doesn't optimize the following as well:
      // return x.a < y.a || (x.a == y.a && x.b < y.b);
      if (x.a.shape_id < y.a.shape_id) return true;
      if (y.a.shape_id < x.a.shape_id) return false;
      if (x.a.edge_id < y.a.edge_id) return true;
      if (y.a.edge_id < x.a.edge_id) return false;
      if (x.b.shape_id < y.b.shape_id) return true;
      if (y.b.shape_id < x.b.shape_id) return false;
      return x.b.edge_id < y.b.edge_id;
    }